

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O2

double __thiscall
duckdb::VectorTryCastOperator<duckdb::VarintToDoubleCast>::Operation<duckdb::string_t,double>
          (VectorTryCastOperator<duckdb::VarintToDoubleCast> *this,string_t input,ValidityMask *mask
          ,idx_t idx,void *dataptr)

{
  bool bVar1;
  undefined8 uVar2;
  double dVar3;
  string_t input_00;
  string_t input_01;
  double output;
  double local_58;
  string local_50;
  
  input_01.value._0_8_ = input.value._0_8_;
  uVar2 = 0;
  input_01.value.pointer.ptr = (char *)&local_58;
  bVar1 = VarintToDoubleCast::Operation<duckdb::string_t,double>
                    ((VarintToDoubleCast *)this,input_01,(double *)0x0,SUB81(idx,0));
  if (!bVar1) {
    input_00.value.pointer.ptr = (char *)uVar2;
    input_00.value._0_8_ = input_01.value._0_8_;
    CastExceptionText<duckdb::string_t,double>(&local_50,(duckdb *)this,input_00);
    dVar3 = HandleVectorCastError::Operation<double>
                      (&local_50,input.value._8_8_,(idx_t)mask,(VectorTryCastData *)idx);
    ::std::__cxx11::string::~string((string *)&local_50);
    local_58 = dVar3;
  }
  return local_58;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		RESULT_TYPE output;
		if (DUCKDB_LIKELY(OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input, output))) {
			return output;
		}
		auto data = reinterpret_cast<VectorTryCastData *>(dataptr);
		return HandleVectorCastError::Operation<RESULT_TYPE>(CastExceptionText<INPUT_TYPE, RESULT_TYPE>(input), mask,
		                                                     idx, *data);
	}